

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int __thiscall
CVmObjString::get_prop
          (CVmObjString *this,vm_prop_id_t prop,vm_val_t *retval,vm_obj_id_t self,
          vm_obj_id_t *source_obj,uint *argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  vm_val_t self_val;
  
  self_val.typ = VM_OBJ;
  self_val.val.obj = self;
  iVar1 = const_get_prop(retval,&self_val,(this->super_CVmObject).ext_,prop,source_obj,argc);
  if (iVar1 == 0) {
    iVar1 = CVmObject::get_prop(&this->super_CVmObject,prop,retval,self,source_obj,argc);
  }
  else {
    vVar2 = CVmMetaclass::get_class_obj(metaclass_reg_);
    *source_obj = vVar2;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int CVmObjString::get_prop(VMG_ vm_prop_id_t prop, vm_val_t *retval,
                           vm_obj_id_t self, vm_obj_id_t *source_obj,
                           uint *argc)
{
    vm_val_t self_val;
    
    /* use the constant evaluator */
    self_val.set_obj(self);
    if (const_get_prop(vmg_ retval, &self_val, ext_, prop, source_obj, argc))
    {
        *source_obj = metaclass_reg_->get_class_obj(vmg0_);
        return TRUE;
    }

    /* inherit default handling from the base object class */
    return CVmObject::get_prop(vmg_ prop, retval, self, source_obj, argc);
}